

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

bool __thiscall
cmDependsC::WriteDependencies
          (cmDependsC *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *makeDepends,ostream *internalDepends)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *this_01;
  UnscannedEntry *pUVar1;
  value_type *pvVar2;
  pointer pbVar3;
  bool bVar4;
  BOM BVar5;
  string *psVar6;
  const_iterator cVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  mapped_type *this_02;
  ostream *poVar11;
  _Base_ptr p_Var12;
  UnscannedEntry *inc;
  value_type *__x;
  pointer in_base;
  int local_39c;
  string fullName;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanned;
  string obj_i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string dir;
  UnscannedEntry current;
  string binDir;
  string obj_m;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [29];
  
  if (((sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&obj_m,"Cannot scan dependencies without a source file.",
               (allocator<char> *)&current);
    cmSystemTools::Error(&obj_m);
  }
  else {
    if (obj->_M_string_length != 0) {
      dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
      dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                         ((this->super_cmDepends).LocalGenerator);
      std::__cxx11::string::string((string *)&binDir,(string *)psVar6);
      cmLocalGenerator::MaybeConvertToRelativePath
                (&obj_i,(this->super_cmDepends).LocalGenerator,&binDir,obj);
      if ((&this->ValidDeps->_M_t ==
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)0x0) ||
         (cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::find(&this->ValidDeps->_M_t,&obj_i),
         (_Rb_tree_header *)cVar7._M_node == &(this->ValidDeps->_M_t)._M_impl.super__Rb_tree_header)
         ) {
        local_39c = (int)(sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        this_00 = &this->Encountered;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this_00->_M_t);
        this_01 = &this->Unscanned;
        for (p_Var12 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var12 != &(sources->_M_t)._M_impl.super__Rb_tree_header;
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
          obj_m._M_dataplus._M_p = (pointer)&obj_m.field_2;
          obj_m._M_string_length = 0;
          obj_m.field_2._M_local_buf[0] = '\0';
          local_218._M_p = (pointer)local_208;
          local_210 = 0;
          local_208[0]._M_local_buf[0] = '\0';
          std::__cxx11::string::_M_assign((string *)&obj_m);
          std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
          push_back(&this_01->c,(UnscannedEntry *)&obj_m);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var12 + 1));
          UnscannedEntry::~UnscannedEntry((UnscannedEntry *)&obj_m);
        }
        scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &scanned._M_t._M_impl.super__Rb_tree_header._M_header;
        scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        scanned._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             scanned._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          pUVar1 = (this->Unscanned).c.
                   super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          if ((this->Unscanned).c.
              super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur == pUVar1) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&scanned._M_t);
            goto LAB_0035d0d2;
          }
          UnscannedEntry::UnscannedEntry(&current,pUVar1);
          std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
          pop_front(&this_01->c);
          fullName._M_dataplus._M_p = (pointer)&fullName.field_2;
          fullName._M_string_length = 0;
          fullName.field_2._M_local_buf[0] = '\0';
          if ((0 < local_39c) ||
             (bVar4 = cmsys::SystemTools::FileIsFullPath(&current.FileName), bVar4)) {
            bVar4 = cmsys::SystemTools::FileExists(&current.FileName,true);
            if (bVar4) goto LAB_0035cdf1;
          }
          else if ((current.QuotedLocation._M_string_length == 0) ||
                  (bVar4 = cmsys::SystemTools::FileExists(&current.QuotedLocation,true), !bVar4)) {
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find(&(this->HeaderLocationCache)._M_t,&current.FileName);
            if ((_Rb_tree_header *)iVar10._M_node ==
                &(this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header) {
              pbVar3 = (this->super_cmDepends).IncludePath.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (in_base = (this->super_cmDepends).IncludePath.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; in_base != pbVar3;
                  in_base = in_base + 1) {
                cmsys::SystemTools::CollapseFullPath(&obj_m,&current.FileName,in_base);
                bVar4 = cmsys::SystemTools::FileExists(&obj_m,true);
                if (bVar4) {
                  std::__cxx11::string::_M_assign((string *)&fullName);
                  this_02 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&this->HeaderLocationCache,&current.FileName);
                  std::__cxx11::string::operator=((string *)this_02,(string *)&obj_m);
                  std::__cxx11::string::~string((string *)&obj_m);
                  break;
                }
                std::__cxx11::string::~string((string *)&obj_m);
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)&fullName);
            }
          }
          else {
LAB_0035cdf1:
            std::__cxx11::string::_M_assign((string *)&fullName);
          }
          if (fullName._M_string_length == 0) {
            bVar4 = cmsys::RegularExpression::find
                              (&this->IncludeRegexComplain,current.FileName._M_dataplus._M_p);
            if (!bVar4) {
              if (fullName._M_string_length != 0) goto LAB_0035ce03;
              goto LAB_0035ce20;
            }
            std::operator+(&dir,"Cannot find file \"",&current.FileName);
            std::operator+(&obj_m,&dir,"\".");
            cmSystemTools::Error(&obj_m);
            std::__cxx11::string::~string((string *)&obj_m);
            std::__cxx11::string::~string((string *)&dir);
            bVar4 = false;
          }
          else {
LAB_0035ce03:
            iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&scanned._M_t,&fullName);
            if ((_Rb_tree_header *)iVar8._M_node == &scanned._M_t._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&scanned,&fullName);
              iVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
                      ::find(&(this->FileCache)._M_t,&fullName);
              if ((_Rb_tree_header *)iVar9._M_node ==
                  &(this->FileCache)._M_t._M_impl.super__Rb_tree_header) {
                std::ifstream::ifstream(&obj_m,fullName._M_dataplus._M_p,_S_in);
                if (((*(byte *)((long)&local_218._M_p + *(long *)(obj_m._M_dataplus._M_p + -0x18)) &
                     5) == 0) &&
                   (BVar5 = cmsys::FStream::ReadBOM((istream *)&obj_m), BVar5 < BOM_UTF16BE)) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&dependencies,&fullName);
                  cmsys::SystemTools::GetFilenamePath(&dir,&fullName);
                  Scan(this,(istream *)&obj_m,&dir,&fullName);
                  std::__cxx11::string::~string((string *)&dir);
                }
                std::ifstream::~ifstream(&obj_m);
              }
              else {
                *(undefined1 *)(*(long *)(iVar9._M_node + 2) + 0x18) = 1;
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&dependencies,&fullName);
                pvVar2 = (value_type *)(*(undefined8 **)(iVar9._M_node + 2))[1];
                for (__x = (value_type *)**(undefined8 **)(iVar9._M_node + 2); __x != pvVar2;
                    __x = __x + 1) {
                  iVar8 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find(&this_00->_M_t,&__x->FileName);
                  if ((_Rb_tree_header *)iVar8._M_node ==
                      &(this->Encountered)._M_t._M_impl.super__Rb_tree_header) {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)this_00,&__x->FileName);
                    std::
                    deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
                    push_back(&this_01->c,__x);
                  }
                }
              }
            }
LAB_0035ce20:
            local_39c = local_39c + -1;
            bVar4 = true;
          }
          std::__cxx11::string::~string((string *)&fullName);
          UnscannedEntry::~UnscannedEntry(&current);
        } while (bVar4);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&scanned._M_t);
        bVar4 = false;
      }
      else {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&dependencies,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (cVar7._M_node + 2),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cVar7._M_node[2]._M_parent);
LAB_0035d0d2:
        cmSystemTools::ConvertToOutputPath(&obj_m,&obj_i);
        poVar11 = std::operator<<(internalDepends,(string *)&obj_i);
        std::endl<char,std::char_traits<char>>(poVar11);
        for (p_Var12 = dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var12 != &dependencies._M_t._M_impl.super__Rb_tree_header;
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
          poVar11 = std::operator<<(makeDepends,(string *)&obj_m);
          poVar11 = std::operator<<(poVar11,": ");
          cmLocalGenerator::MaybeConvertToRelativePath
                    ((string *)&scanned,(this->super_cmDepends).LocalGenerator,&binDir,
                     (string *)(p_Var12 + 1));
          cmSystemTools::ConvertToOutputPath(&current.FileName,(string *)&scanned);
          poVar11 = std::operator<<(poVar11,(string *)&current);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::string::~string((string *)&current);
          std::__cxx11::string::~string((string *)&scanned);
          poVar11 = std::operator<<(internalDepends," ");
          poVar11 = std::operator<<(poVar11,(string *)(p_Var12 + 1));
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        std::endl<char,std::char_traits<char>>(makeDepends);
        std::__cxx11::string::~string((string *)&obj_m);
        bVar4 = true;
      }
      std::__cxx11::string::~string((string *)&obj_i);
      std::__cxx11::string::~string((string *)&binDir);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&dependencies._M_t);
      return bVar4;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&obj_m,"Cannot scan dependencies without an object file.",
               (allocator<char> *)&current);
    cmSystemTools::Error(&obj_m);
  }
  std::__cxx11::string::~string((string *)&obj_m);
  return false;
}

Assistant:

bool cmDependsC::WriteDependencies(const std::set<std::string>& sources,
                                   const std::string& obj,
                                   std::ostream& makeDepends,
                                   std::ostream& internalDepends)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  std::set<std::string> dependencies;
  bool haveDeps = false;

  std::string binDir = this->LocalGenerator->GetBinaryDirectory();

  // Compute a path to the object file to write to the internal depend file.
  // Any existing content of the internal depend file has already been
  // loaded in ValidDeps with this path as a key.
  std::string obj_i =
    this->LocalGenerator->MaybeConvertToRelativePath(binDir, obj);

  if (this->ValidDeps != nullptr) {
    auto const tmpIt = this->ValidDeps->find(obj_i);
    if (tmpIt != this->ValidDeps->end()) {
      dependencies.insert(tmpIt->second.begin(), tmpIt->second.end());
      haveDeps = true;
    }
  }

  if (!haveDeps) {
    // Walk the dependency graph starting with the source file.
    int srcFiles = static_cast<int>(sources.size());
    this->Encountered.clear();

    for (std::string const& src : sources) {
      UnscannedEntry root;
      root.FileName = src;
      this->Unscanned.push(root);
      this->Encountered.insert(src);
    }

    std::set<std::string> scanned;
    while (!this->Unscanned.empty()) {
      // Get the next file to scan.
      UnscannedEntry current = this->Unscanned.front();
      this->Unscanned.pop();

      // If not a full path, find the file in the include path.
      std::string fullName;
      if ((srcFiles > 0) || cmSystemTools::FileIsFullPath(current.FileName)) {
        if (cmSystemTools::FileExists(current.FileName, true)) {
          fullName = current.FileName;
        }
      } else if (!current.QuotedLocation.empty() &&
                 cmSystemTools::FileExists(current.QuotedLocation, true)) {
        // The include statement producing this entry was a double-quote
        // include and the included file is present in the directory of
        // the source containing the include statement.
        fullName = current.QuotedLocation;
      } else {
        auto headerLocationIt =
          this->HeaderLocationCache.find(current.FileName);
        if (headerLocationIt != this->HeaderLocationCache.end()) {
          fullName = headerLocationIt->second;
        } else {
          for (std::string const& iPath : this->IncludePath) {
            // Construct the name of the file as if it were in the current
            // include directory.  Avoid using a leading "./".
            std::string tmpPath =
              cmSystemTools::CollapseFullPath(current.FileName, iPath);

            // Look for the file in this location.
            if (cmSystemTools::FileExists(tmpPath, true)) {
              fullName = tmpPath;
              this->HeaderLocationCache[current.FileName] = std::move(tmpPath);
              break;
            }
          }
        }
      }

      // Complain if the file cannot be found and matches the complain
      // regex.
      if (fullName.empty() &&
          this->IncludeRegexComplain.find(current.FileName)) {
        cmSystemTools::Error("Cannot find file \"" + current.FileName + "\".");
        return false;
      }

      // Scan the file if it was found and has not been scanned already.
      if (!fullName.empty() && (scanned.find(fullName) == scanned.end())) {
        // Record scanned files.
        scanned.insert(fullName);

        // Check whether this file is already in the cache
        auto fileIt = this->FileCache.find(fullName);
        if (fileIt != this->FileCache.end()) {
          fileIt->second->Used = true;
          dependencies.insert(fullName);
          for (UnscannedEntry const& inc : fileIt->second->UnscannedEntries) {
            if (this->Encountered.find(inc.FileName) ==
                this->Encountered.end()) {
              this->Encountered.insert(inc.FileName);
              this->Unscanned.push(inc);
            }
          }
        } else {

          // Try to scan the file.  Just leave it out if we cannot find
          // it.
          cmsys::ifstream fin(fullName.c_str());
          if (fin) {
            cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
            if (bom == cmsys::FStream::BOM_None ||
                bom == cmsys::FStream::BOM_UTF8) {
              // Add this file as a dependency.
              dependencies.insert(fullName);

              // Scan this file for new dependencies.  Pass the directory
              // containing the file to handle double-quote includes.
              std::string dir = cmSystemTools::GetFilenamePath(fullName);
              this->Scan(fin, dir, fullName);
            } else {
              // Skip file with encoding we do not implement.
            }
          }
        }
      }

      srcFiles--;
    }
  }

  // Write the dependencies to the output stream.  Makefile rules
  // written by the original local generator for this directory
  // convert the dependencies to paths relative to the home output
  // directory.  We must do the same here.
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i);
  internalDepends << obj_i << std::endl;

  for (std::string const& dep : dependencies) {
    makeDepends << obj_m << ": "
                << cmSystemTools::ConvertToOutputPath(
                     this->LocalGenerator->MaybeConvertToRelativePath(binDir,
                                                                      dep))
                << std::endl;
    internalDepends << " " << dep << std::endl;
  }
  makeDepends << std::endl;

  return true;
}